

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_timer.c
# Opt level: O0

int main(void)

{
  cio_error cVar1;
  __sighandler_t p_Var2;
  undefined1 local_58 [8];
  cio_timer timer;
  cio_error local_10;
  cio_error err;
  int ret;
  
  local_10 = CIO_SUCCESS;
  p_Var2 = signal(0xf,sighandler);
  if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
    err = CIO_OPERATION_NOT_PERMITTED;
  }
  else {
    p_Var2 = signal(2,sighandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,(__sighandler_t)0x0);
      err = CIO_OPERATION_NOT_PERMITTED;
    }
    else {
      timer.impl.loop._4_4_ = cio_eventloop_init(&loop);
      if (timer.impl.loop._4_4_ == CIO_SUCCESS) {
        timer.impl.loop._4_4_ =
             cio_timer_init((cio_timer *)local_58,&loop,(cio_timer_close_hook_t)0x0);
        if (timer.impl.loop._4_4_ == CIO_SUCCESS) {
          cVar1 = cio_timer_expires_from_now
                            ((cio_timer *)local_58,5000000000,handle_timeout,(void *)0x0);
          if (cVar1 == CIO_SUCCESS) {
            timer.impl.loop._4_4_ = cio_eventloop_run(&loop);
            if (timer.impl.loop._4_4_ != CIO_SUCCESS) {
              fprintf(_stderr,"error in cio_eventloop_run!\n");
            }
          }
          else {
            fprintf(_stderr,"arming timer failed!\n");
            local_10 = CIO_EOF;
          }
        }
        else {
          local_10 = CIO_EOF;
        }
        cio_eventloop_destroy(&loop);
        err = local_10;
      }
      else {
        err = CIO_EOF;
      }
    }
  }
  return err;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;

	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	enum cio_error err = cio_eventloop_init(&loop);
	if (err != CIO_SUCCESS) {
		return EXIT_FAILURE;
	}

	struct cio_timer timer;
	err = cio_timer_init(&timer, &loop, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	if (cio_timer_expires_from_now(&timer, FIVE_S, handle_timeout, NULL) != CIO_SUCCESS) {
		(void)fprintf(stderr, "arming timer failed!\n");
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "error in cio_eventloop_run!\n");
	}

destroy_loop:
	cio_eventloop_destroy(&loop);

	return ret;
}